

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

bool vkt::SpirVAssembly::compareFloats
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *param_1,
               vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *log)

{
  ostringstream *this;
  void *pvVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  float actual;
  float expected;
  float local_1c0;
  float local_1bc;
  TestLog *local_1b8;
  MessageBuilder local_1b0;
  
  lVar4 = 0;
  uVar5 = 0;
  local_1b8 = log;
  do {
    uVar3 = (long)(outputAllocs->
                  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(outputAllocs->
                  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar3 <= uVar5) {
LAB_005770c3:
      return uVar3 <= uVar5;
    }
    pvVar1 = (void *)(**(code **)(**(long **)((long)&((expectedOutputs->
                                                                                                            
                                                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->m_ptr
                                             + lVar4) + 0x18))();
    sVar2 = (**(code **)(**(long **)((long)&((expectedOutputs->
                                             super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar4) + 0x10))();
    memcpy(&local_1bc,pvVar1,sVar2);
    pvVar1 = *(void **)(*(long *)((long)&((outputAllocs->
                                          super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar4
                                 ) + 0x18);
    sVar2 = (**(code **)(**(long **)((long)&((expectedOutputs->
                                             super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar4) + 0x10))();
    memcpy(&local_1c0,pvVar1,sVar2);
    if (1e-05 < ABS(local_1bc - local_1c0)) {
      this = &local_1b0.m_str;
      local_1b0.m_log = local_1b8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"Error: The actual and expected values not matching.");
      std::operator<<((ostream *)this," Expected: ");
      std::ostream::operator<<(this,local_1bc);
      std::operator<<((ostream *)this," Actual: ");
      std::ostream::operator<<(this,local_1c0);
      std::operator<<((ostream *)this," Epsilon: ");
      std::ostream::operator<<(this,1e-05);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      goto LAB_005770c3;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

bool compareFloats (const std::vector<BufferSp>&, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog& log)
{
	DE_ASSERT(outputAllocs.size() != 0);
	DE_ASSERT(outputAllocs.size() == expectedOutputs.size());

	// Use custom epsilon because of the float->string conversion
	const float	epsilon	= 0.00001f;

	for (size_t outputNdx = 0; outputNdx < outputAllocs.size(); ++outputNdx)
	{
		float expected;
		memcpy(&expected, expectedOutputs[outputNdx]->data(), expectedOutputs[outputNdx]->getNumBytes());

		float actual;
		memcpy(&actual, outputAllocs[outputNdx]->getHostPtr(), expectedOutputs[outputNdx]->getNumBytes());

		// Test with epsilon
		if (fabs(expected - actual) > epsilon)
		{
			log << TestLog::Message << "Error: The actual and expected values not matching."
				<< " Expected: " << expected << " Actual: " << actual << " Epsilon: " << epsilon << TestLog::EndMessage;
			return false;
		}
	}
	return true;
}